

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_78::BinaryReaderIR::OnBrOnExnExpr
          (BinaryReaderIR *this,Index depth,Index event_index)

{
  Index IVar1;
  Result RVar2;
  pointer pBVar3;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_100;
  Location local_f8;
  Var local_d8;
  Location local_90;
  Var local_70;
  unique_ptr<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_> local_28;
  unique_ptr<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_> expr;
  Index event_index_local;
  Index depth_local;
  BinaryReaderIR *this_local;
  
  expr._M_t.super___uniq_ptr_impl<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::BrOnExnExpr_*,_std::default_delete<wabt::BrOnExnExpr>_>.
  super__Head_base<0UL,_wabt::BrOnExnExpr_*,_false>._M_head_impl._0_4_ = event_index;
  expr._M_t.super___uniq_ptr_impl<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_>._M_t.
  super__Tuple_impl<0UL,_wabt::BrOnExnExpr_*,_std::default_delete<wabt::BrOnExnExpr>_>.
  super__Head_base<0UL,_wabt::BrOnExnExpr_*,_false>._M_head_impl._4_4_ = depth;
  MakeUnique<wabt::BrOnExnExpr>();
  IVar1 = expr._M_t.
          super___uniq_ptr_impl<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_>._M_t.
          super__Tuple_impl<0UL,_wabt::BrOnExnExpr_*,_std::default_delete<wabt::BrOnExnExpr>_>.
          super__Head_base<0UL,_wabt::BrOnExnExpr_*,_false>._M_head_impl._4_4_;
  Location::Location(&local_90);
  Var::Var(&local_70,IVar1,&local_90);
  pBVar3 = std::unique_ptr<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_>::operator->
                     (&local_28);
  Var::operator=(&pBVar3->label_var,&local_70);
  Var::~Var(&local_70);
  IVar1 = (Index)expr._M_t.
                 super___uniq_ptr_impl<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wabt::BrOnExnExpr_*,_std::default_delete<wabt::BrOnExnExpr>_>
                 .super__Head_base<0UL,_wabt::BrOnExnExpr_*,_false>._M_head_impl;
  Location::Location(&local_f8);
  Var::Var(&local_d8,IVar1,&local_f8);
  pBVar3 = std::unique_ptr<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_>::operator->
                     (&local_28);
  Var::operator=(&pBVar3->event_var,&local_d8);
  Var::~Var(&local_d8);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::BrOnExnExpr,std::default_delete<wabt::BrOnExnExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_100,&local_28);
  RVar2 = AppendExpr(this,&local_100);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_100);
  std::unique_ptr<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_>::~unique_ptr
            (&local_28);
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnBrOnExnExpr(Index depth, Index event_index) {
  auto expr = MakeUnique<BrOnExnExpr>();
  expr->label_var = Var(depth);
  expr->event_var = Var(event_index);
  return AppendExpr(std::move(expr));
}